

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
         *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool *pbVar2;
  qpTestLog *pqVar3;
  ostringstream *poVar4;
  _Rb_tree_node_base *p_Var5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar7;
  ShaderExecutor *pSVar8;
  Variable<tcu::Vector<float,_4>_> *pVVar9;
  pointer pcVar10;
  Variable<tcu::Matrix<float,_4,_4>_> *pVVar11;
  double dVar12;
  double dVar13;
  pointer pVVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  _Rb_tree_node_base *p_Var19;
  long lVar20;
  IVal *pIVar21;
  IVal *pIVar22;
  undefined8 *puVar23;
  long lVar24;
  undefined1 *puVar25;
  Vector<float,_4> *val;
  int row;
  size_t sVar26;
  Interval *__return_storage_ptr___00;
  string *psVar27;
  long lVar28;
  TestLog TVar29;
  FloatFormat *pFVar30;
  Environment *this_01;
  TestStatus *pTVar31;
  byte bVar32;
  IVal in2;
  IVal in3;
  IVal in1;
  Environment env;
  FuncSet funcs;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_> outputs;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  ostringstream oss;
  void *inputArr [4];
  IVal reference0;
  ResultCollector status;
  float in_stack_fffffffffffffa18;
  _Alloc_hider _Var33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5c0;
  double local_5b8;
  string local_5b0;
  size_t local_590;
  ulong local_588;
  FloatFormat *local_580;
  long local_578;
  undefined1 local_570 [16];
  undefined1 local_560 [96];
  _Rb_tree_node_base local_500;
  double local_4e0;
  undefined1 local_4d8 [12];
  YesNoMaybe YStack_4cc;
  TestLog local_4c8;
  _Rb_tree_node_base *local_4c0;
  _Rb_tree_node_base *local_4b8;
  double local_4b0;
  undefined1 local_478 [16];
  double local_468;
  double dStack_460;
  double local_458;
  double local_450;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
  local_448;
  pointer local_418;
  pointer local_410;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_408;
  undefined1 local_3a8 [8];
  double dStack_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  double local_388;
  Precision local_380;
  Environment *local_378;
  undefined4 local_370;
  ios_base local_338 [8];
  ios_base local_330 [264];
  pointer local_228;
  pointer local_220;
  pointer local_218;
  pointer local_210;
  undefined1 local_200 [16];
  TestLog local_1f0 [12];
  ios_base local_190 [8];
  ios_base local_188 [264];
  ResultCollector local_80;
  
  bVar32 = 0;
  this_00 = this->m_samplings;
  pFVar30 = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar26 = (this->m_caseCtx).numRandoms;
  local_560._80_8_ = __return_storage_ptr__;
  iVar17 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_580 = pFVar30;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_408,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar30,(FloatFormat *)(ulong)PVar6,(Precision)sVar26,(ulong)(iVar17 + 0xdeadbeef),
             (deUint32)in_stack_fffffffffffffa18);
  pVVar14 = local_408.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  sVar26 = (long)local_408.in0.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_408.in0.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>::Outputs
            (&local_448,sVar26);
  local_458 = (this->m_caseCtx).highpFormat.m_maxValue;
  local_478._0_8_ = *(undefined8 *)&(this->m_caseCtx).highpFormat;
  local_478._8_8_ = *(undefined8 *)&(this->m_caseCtx).highpFormat.m_fractionBits;
  local_468 = *(double *)&(this->m_caseCtx).highpFormat.m_hasInf;
  dStack_460 = *(double *)&(this->m_caseCtx).highpFormat.m_exactPrecision;
  local_500._M_left = &local_500;
  local_500._M_color = _S_red;
  local_500._M_parent = (_Base_ptr)0x0;
  local_4e0 = 0.0;
  local_500._M_right = local_500._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_5c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_228 = local_408.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_220 = local_408.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_218 = local_408.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_210 = local_408.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_418 = local_448.out0.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_410 = local_448.out1.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_200 + 8);
  local_200._0_8_ = local_5c0;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_188);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
  p_Var5 = (_Rb_tree_node_base *)(local_4d8 + 8);
  local_4d8._8_4_ = _S_red;
  local_4c8.m_log = (qpTestLog *)0x0;
  local_4b0 = 0.0;
  pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_590 = sVar26;
  local_4c0 = p_Var5;
  local_4b8 = p_Var5;
  (*pSVar7->_vptr_Statement[4])(pSVar7,local_4d8);
  if (local_4c0 != p_Var5) {
    p_Var19 = local_4c0;
    do {
      (**(code **)(**(long **)(p_Var19 + 1) + 0x30))(*(long **)(p_Var19 + 1),local_3a8);
      p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
    } while (p_Var19 != p_Var5);
  }
  sVar26 = local_590;
  if (local_4b0 != 0.0) {
    poVar4 = (ostringstream *)(local_200 + 8);
    local_200._0_8_ = local_5c0;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,(char *)local_570._0_8_,local_570._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_570._0_8_ != (IVal *)local_560) {
      operator_delete((void *)local_570._0_8_,local_560._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_188);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_4d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
  std::ios_base::~ios_base(local_338);
  pSVar8 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar8->_vptr_ShaderExecutor[2])(pSVar8,sVar26 & 0xffffffff,&local_228,&local_418,0);
  lVar20 = 8;
  do {
    local_3a8[lVar20 + -8] = 0;
    *(undefined8 *)(local_3a8 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)((long)&dStack_3a0 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  lVar20 = 8;
  do {
    local_3a8[lVar20 + -8] = 0;
    *(undefined8 *)(local_3a8 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)((long)&dStack_3a0 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_200);
  lVar20 = 8;
  do {
    *(undefined1 *)((long)&local_4e0 + lVar20) = 0;
    *(undefined8 *)(local_4d8 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_4d8 + lVar20 + 8) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  lVar20 = 8;
  do {
    *(undefined1 *)((long)&local_4e0 + lVar20) = 0;
    *(undefined8 *)(local_4d8 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_4d8 + lVar20 + 8) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)(local_560 + 0x58),
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_3a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)(local_560 + 0x58),
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_570);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)(local_560 + 0x58),
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa18);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)(local_560 + 0x58),
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_5b0);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)(local_560 + 0x58),
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.m_ptr,
             (IVal *)local_200);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)(local_560 + 0x58),
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_4d8);
  if (local_408.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar14) {
LAB_00953956:
    poVar4 = (ostringstream *)(local_200 + 8);
    local_200._0_8_ = local_5c0;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    pTVar31 = (TestStatus *)local_560._80_8_;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_188);
    local_200._0_8_ = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"Pass","");
    *&pTVar31->m_code = QP_TEST_RESULT_PASS;
    (((string *)((long)pTVar31 + 8))->_M_dataplus)._M_p =
         (pointer)&((string *)((long)pTVar31 + 8))->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)pTVar31 + 8),local_200._0_8_,
               (long)(qpTestLog **)local_200._0_8_ + local_200._8_8_);
    local_4d8._0_8_ = local_200._0_8_;
    if ((TestLog *)local_200._0_8_ == local_1f0) goto LAB_00953b2e;
  }
  else {
    local_450 = (double)(sVar26 + (sVar26 == 0));
    local_5b8 = 0.0;
    local_588 = 0;
    pFVar30 = local_580;
    do {
      this_01 = (Environment *)(local_560 + 0x58);
      tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_200);
      lVar20 = 8;
      do {
        *(undefined1 *)((long)&local_4e0 + lVar20) = 0;
        *(undefined8 *)(local_4d8 + lVar20) = 0x7ff0000000000000;
        *(undefined8 *)(local_4d8 + lVar20 + 8) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x68);
      lVar20 = 8;
      do {
        *(undefined1 *)((long)&local_4e0 + lVar20) = 0;
        *(undefined8 *)(local_4d8 + lVar20) = 0x7ff0000000000000;
        *(undefined8 *)(local_4d8 + lVar20 + 8) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x68);
      local_578 = (long)local_5b8 * 0x10;
      _Var33._M_p = *(pointer *)
                     local_408.in0.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)local_5b8].m_data;
      lVar20 = *(long *)(local_408.in0.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)local_5b8].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_570,pFVar30,(Vector<float,_4> *)&stack0xfffffffffffffa18);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_3a8,pFVar30,(IVal *)local_570);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          (this_01,(this->m_variables).in0.
                                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                                   .m_ptr);
      puVar23 = (undefined8 *)local_3a8;
      for (lVar24 = 0xc; lVar24 != 0; lVar24 = lVar24 + -1) {
        *(undefined8 *)pIVar21->m_data = *puVar23;
        puVar23 = puVar23 + (ulong)bVar32 * -2 + 1;
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar32 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                (this_01,(this->m_variables).in1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                         .m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                (this_01,(this->m_variables).in2.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                         .m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                (this_01,(this->m_variables).in3.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                         .m_ptr);
      local_380 = (this->m_caseCtx).precision;
      local_388 = pFVar30->m_maxValue;
      local_3a8 = *(undefined1 (*) [8])pFVar30;
      dStack_3a0 = *(double *)&pFVar30->m_fractionBits;
      local_398._M_allocated_capacity = *(undefined8 *)&pFVar30->m_hasInf;
      local_398._8_1_ = pFVar30->m_exactPrecision;
      local_398._9_3_ = *(undefined3 *)&pFVar30->field_0x19;
      local_398._12_4_ = *(undefined4 *)&pFVar30->field_0x1c;
      local_370 = 0;
      pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_378 = this_01;
      (*pSVar7->_vptr_Statement[3])(pSVar7,(string *)local_3a8);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          (this_01,(this->m_variables).out1.
                                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                                   .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_3a8,(FloatFormat *)local_478,pIVar21);
      psVar27 = (string *)local_3a8;
      pIVar21 = (IVal *)local_4d8;
      for (lVar24 = 0xc; lVar24 != 0; lVar24 = lVar24 + -1) {
        *(pointer *)pIVar21->m_data = (psVar27->_M_dataplus)._M_p;
        psVar27 = (string *)((long)psVar27 + (ulong)bVar32 * -0x10 + 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar32 * -2 + 1) * 8);
      }
      bVar15 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_4d8,
                          (Vector<float,_4> *)
                          ((long)(local_448.out1.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + local_578));
      local_3a8 = (undefined1  [8])&local_398;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,"Shader output 1 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check(&local_80,bVar15,(string *)local_3a8);
      if (local_3a8 != (undefined1  [8])&local_398) {
        operator_delete((void *)local_3a8,local_398._M_allocated_capacity + 1);
      }
      pIVar22 = Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)(local_560 + 0x58),
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      __return_storage_ptr___00 = (Interval *)local_3a8;
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)__return_storage_ptr___00,(FloatFormat *)local_478,pIVar22);
      dVar13 = local_5b8;
      puVar25 = local_200;
      lVar24 = 0;
      do {
        lVar28 = 0;
        do {
          *(undefined8 *)(puVar25 + lVar28 + 0x10) =
               *(undefined8 *)((long)&__return_storage_ptr___00->m_hi + lVar28);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)
                    &__return_storage_ptr___00->m_hasNaN)->m_data[0].m_data[0].m_hasNaN + lVar28;
          dVar12 = *(double *)(pbVar2 + 8);
          *(undefined8 *)(puVar25 + lVar28) = *(undefined8 *)pbVar2;
          *(double *)((long)(puVar25 + lVar28) + 8) = dVar12;
          lVar28 = lVar28 + 0x60;
        } while (lVar28 != 0x180);
        lVar24 = lVar24 + 1;
        puVar25 = puVar25 + 0x18;
        __return_storage_ptr___00 = __return_storage_ptr___00 + 1;
      } while (lVar24 != 4);
      bVar16 = contains<tcu::Matrix<float,4,4>>
                         ((IVal *)local_200,
                          local_448.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_5b8);
      local_3a8 = (undefined1  [8])&local_398;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,"Shader output 0 is outside acceptable range","");
      bVar16 = tcu::ResultCollector::check(&local_80,bVar16,(string *)local_3a8);
      if (local_3a8 != (undefined1  [8])&local_398) {
        operator_delete((void *)local_3a8,local_398._M_allocated_capacity + 1);
      }
      pFVar30 = local_580;
      if ((!bVar15 || !bVar16) &&
         (uVar18 = (int)local_588 + 1, local_588 = (ulong)uVar18, (int)uVar18 < 0x65)) {
        local_3a8 = (undefined1  [8])local_5c0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_3a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_3a0,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_3a0," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_3a0,"\t",1);
        pVVar9 = (this->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        val = (Vector<float,_4> *)local_560;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_570._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_570,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_3a0,(char *)local_570._0_8_,local_570._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_3a0," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)&stack0xfffffffffffffa18,(shaderexecutor *)local_478,
                   (FloatFormat *)
                   ((long)(local_408.in0.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_578),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_3a0,_Var33._M_p,lVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_3a0,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var33._M_p != &local_5d8) {
          operator_delete(_Var33._M_p,local_5d8._M_allocated_capacity + 1);
        }
        if ((Vector<float,_4> *)local_570._0_8_ != (Vector<float,_4> *)local_560) {
          operator_delete((void *)local_570._0_8_,local_560._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_3a0,"\t",1);
        pVVar11 = (this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.
                  m_ptr;
        pIVar22 = (IVal *)local_560;
        pcVar10 = (pVVar11->m_name)._M_dataplus._M_p;
        local_570._0_8_ = pIVar22;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_570,pcVar10,pcVar10 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_3a0,(char *)local_570._0_8_,local_570._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_3a0," = ",3);
        valueToString<tcu::Matrix<float,4,4>>
                  ((string *)&stack0xfffffffffffffa18,(shaderexecutor *)local_478,
                   (FloatFormat *)
                   (local_448.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)dVar13),
                   (Matrix<float,_4,_4> *)pIVar22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_3a0,_Var33._M_p,lVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_3a0,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_3a0,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,4>>
                  (&local_5b0,(shaderexecutor *)local_478,(FloatFormat *)local_200,pIVar22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_3a0,local_5b0._M_dataplus._M_p,local_5b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_3a0,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var33._M_p != &local_5d8) {
          operator_delete(_Var33._M_p,local_5d8._M_allocated_capacity + 1);
        }
        if ((IVal *)local_570._0_8_ != (IVal *)local_560) {
          operator_delete((void *)local_570._0_8_,local_560._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_3a0,"\t",1);
        pVVar9 = (this->m_variables).out1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        pIVar21 = (IVal *)local_560;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_570._0_8_ = pIVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_570,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_3a0,(char *)local_570._0_8_,local_570._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_3a0," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)&stack0xfffffffffffffa18,(shaderexecutor *)local_478,
                   (FloatFormat *)
                   ((long)(local_448.out1.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_578),
                   (Vector<float,_4> *)pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_3a0,_Var33._M_p,lVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_3a0,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_3a0,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  (&local_5b0,(shaderexecutor *)local_478,(FloatFormat *)local_4d8,pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_3a0,local_5b0._M_dataplus._M_p,local_5b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_3a0,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var33._M_p != &local_5d8) {
          operator_delete(_Var33._M_p,local_5d8._M_allocated_capacity + 1);
        }
        if ((IVal *)local_570._0_8_ != (IVal *)local_560) {
          operator_delete((void *)local_570._0_8_,local_560._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_3a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_3a0);
        std::ios_base::~ios_base(local_330);
      }
      local_5b8 = (double)((long)local_5b8 + 1);
    } while (local_5b8 != local_450);
    iVar17 = (int)local_588;
    if (iVar17 < 0x65) {
      if (iVar17 == 0) goto LAB_00953956;
    }
    else {
      poVar4 = (ostringstream *)(local_200 + 8);
      local_200._0_8_ = local_5c0;
      std::__cxx11::ostringstream::ostringstream(poVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
      std::ostream::operator<<(poVar4,iVar17 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      std::ios_base::~ios_base(local_188);
    }
    poVar4 = (ostringstream *)(local_200 + 8);
    local_200._0_8_ = local_5c0;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_188);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,iVar17);
    pTVar31 = (TestStatus *)local_560._80_8_;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    local_200._0_8_ = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200," test failed. Check log for the details","");
    pqVar3 = (qpTestLog *)(local_200._8_8_ + CONCAT44(YStack_4cc,local_4d8._8_4_));
    TVar29.m_log = (qpTestLog *)0xf;
    if ((TestLog *)local_4d8._0_8_ != &local_4c8) {
      TVar29.m_log = local_4c8.m_log;
    }
    if (TVar29.m_log < pqVar3) {
      TVar29.m_log = (qpTestLog *)0xf;
      if ((TestLog *)local_200._0_8_ != local_1f0) {
        TVar29.m_log = local_1f0[0].m_log;
      }
      if (TVar29.m_log < pqVar3) goto LAB_00953944;
      puVar23 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_200,0,(char *)0x0,local_4d8._0_8_);
    }
    else {
LAB_00953944:
      puVar23 = (undefined8 *)std::__cxx11::string::_M_append(local_4d8,local_200._0_8_);
    }
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar23 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar23 == paVar1) {
      local_398._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_398._8_4_ = *(undefined4 *)(puVar23 + 3);
      local_398._12_4_ = *(undefined4 *)((long)puVar23 + 0x1c);
      local_3a8 = (undefined1  [8])&local_398;
    }
    else {
      local_398._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_3a8 = (undefined1  [8])*puVar23;
    }
    dStack_3a0 = (double)puVar23[1];
    *puVar23 = paVar1;
    puVar23[1] = 0;
    paVar1->_M_local_buf[0] = '\0';
    *&pTVar31->m_code = QP_TEST_RESULT_FAIL;
    (((string *)((long)pTVar31 + 8))->_M_dataplus)._M_p =
         (pointer)&((string *)((long)pTVar31 + 8))->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)pTVar31 + 8),local_3a8,(char *)((long)local_3a8 + (long)dStack_3a0))
    ;
    if (local_3a8 != (undefined1  [8])&local_398) {
      operator_delete((void *)local_3a8,local_398._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_200._0_8_ != local_1f0) {
      operator_delete((void *)local_200._0_8_,(ulong)((long)&(local_1f0[0].m_log)->flags + 1));
    }
    local_1f0[0].m_log = local_4c8.m_log;
    if ((TestLog *)local_4d8._0_8_ == &local_4c8) goto LAB_00953b2e;
  }
  operator_delete((void *)local_4d8._0_8_,(ulong)((long)&(local_1f0[0].m_log)->flags + 1));
LAB_00953b2e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
               *)(local_560 + 0x58));
  if (local_448.out1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_448.out1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_448.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_448.out0.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_448.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_448.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar31;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}